

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

PrimInfo *
embree::sse2::createPrimRefArrayGrids
          (PrimInfo *__return_storage_ptr__,GridMesh *mesh,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SubGridBuildData *ptr;
  PrimRef *ptr_00;
  MemoryMonitorInterface *pMVar3;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  task *ptVar7;
  size_t sVar8;
  SubGridBuildData *pSVar9;
  PrimRef *pPVar10;
  long lVar11;
  runtime_error *prVar12;
  ulong uVar13;
  size_t *psVar14;
  size_t sVar15;
  ulong uVar16;
  _func_int **pp_Var17;
  ulong uVar18;
  ulong uVar19;
  _func_int **pp_Var20;
  PrimInfo *pPVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  size_t taskCount;
  uint geomID_;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  _func_int **local_2960;
  PrimInfo *local_2958;
  ulong local_2950 [2];
  ulong **local_2940;
  task_traits local_2938;
  undefined4 local_292c;
  GridMesh *local_2928;
  GridMesh **local_2920;
  mvector<PrimRef> *local_2918;
  mvector<SubGridBuildData> *local_2910;
  undefined4 *local_2908;
  ulong *local_2900;
  ulong *local_28f8;
  _func_int ***local_28f0;
  undefined1 *local_28e8;
  GridMesh ***local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context local_28b8;
  undefined1 local_2838 [5192];
  size_t local_13f0 [632];
  
  local_2920 = &local_2928;
  local_2918 = (mvector<PrimRef> *)&local_292c;
  local_292c = 0xffffffff;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = (ulong)(mesh->super_Geometry).numPrimitives;
  local_2950[1] = 0;
  local_2958 = __return_storage_ptr__;
  local_2950[0] = uVar13;
  local_2928 = mesh;
  iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var20 = (_func_int **)(uVar13 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar6 < pp_Var20) {
    pp_Var20 = (_func_int **)(long)iVar6;
  }
  pp_Var17 = (_func_int **)0x40;
  if (pp_Var20 < (_func_int **)0x40) {
    pp_Var17 = pp_Var20;
  }
  local_28f0 = &local_2960;
  local_2900 = local_2950 + 1;
  local_28f8 = local_2950;
  local_28e8 = local_2838;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2960 = pp_Var17;
  local_28e0 = &local_2920;
  tbb::detail::r1::initialize(&local_28b8);
  local_2940 = &local_2900;
  if (pp_Var20 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar7->m_reserved[3] = 0;
    ptVar7->m_reserved[4] = 0;
    ptVar7->m_reserved[1] = 0;
    ptVar7->m_reserved[2] = 0;
    (ptVar7->super_task_traits).m_version_and_traits = 0;
    ptVar7->m_reserved[0] = 0;
    ptVar7->m_reserved[5] = 0;
    ptVar7->_vptr_task = (_func_int **)&PTR__task_0218a278;
    ptVar7[1]._vptr_task = pp_Var17;
    ptVar7[1].super_task_traits.m_version_and_traits = 0;
    ptVar7[1].m_reserved[0] = 1;
    ptVar7[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar7[1].m_reserved[2] = 0;
    ptVar7[1].m_reserved[3] = 1;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar7[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar7[2]._vptr_task + 4) = 5;
    ptVar7[1].m_reserved[5] = (long)iVar6 * 2 & 0x7ffffffffffffffe;
    ptVar7[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar7[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar7,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  pPVar21 = local_2958;
  if (cVar5 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar22 = _DAT_01f7a9f0;
  aVar23 = _DAT_01f7aa00;
  aVar24 = _DAT_01f7a9f0;
  aVar25 = _DAT_01f7aa00;
  if (local_2960 == (_func_int **)0x0) {
    sVar8 = 0;
    sVar15 = 0;
  }
  else {
    psVar14 = local_13f0;
    sVar15 = 0;
    sVar8 = 0;
    pp_Var20 = local_2960;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -9) = aVar24;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -7) = aVar25;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -5) = aVar22;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -3) = aVar23;
      psVar14[-1] = sVar8;
      *psVar14 = sVar15;
      aVar24.m128 = (__m128)minps(aVar24.m128,*(undefined1 (*) [16])(psVar14 + -0x289));
      aVar25.m128 = (__m128)maxps(aVar25.m128,*(undefined1 (*) [16])(psVar14 + -0x287));
      aVar22.m128 = (__m128)minps(aVar22.m128,*(undefined1 (*) [16])(psVar14 + -0x285));
      aVar23.m128 = (__m128)maxps(aVar23.m128,*(undefined1 (*) [16])(psVar14 + -0x283));
      sVar8 = sVar8 + psVar14[-0x281];
      sVar15 = sVar15 + psVar14[-0x280];
      psVar14 = psVar14 + 10;
      pp_Var20 = (_func_int **)((long)pp_Var20 + -1);
    } while (pp_Var20 != (_func_int **)0x0);
  }
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar24;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar25;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar22;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar23;
  pPVar21->begin = sVar8;
  pPVar21->end = sVar15;
  uVar16 = sVar15 - sVar8;
  uVar13 = sgrids->size_alloced;
  uVar18 = uVar13;
  if ((uVar13 < uVar16) && (uVar18 = uVar16, uVar19 = uVar13, uVar13 != 0)) {
    do {
      uVar18 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0);
      uVar19 = uVar18;
    } while (uVar18 < uVar16);
  }
  if (uVar16 < sgrids->size_active) {
    sgrids->size_active = uVar16;
  }
  if (uVar13 == uVar18) {
    sgrids->size_active = uVar16;
  }
  else {
    ptr = sgrids->items;
    if (uVar18 == 0) {
      uVar13 = 0;
LAB_00b5cd47:
      pSVar9 = (SubGridBuildData *)alignedMalloc(uVar13,4);
    }
    else {
      pMVar3 = (sgrids->alloc).device;
      uVar13 = uVar18 * 8;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar13,0);
      if (uVar13 < 0x1c00000) goto LAB_00b5cd47;
      pSVar9 = (SubGridBuildData *)os_malloc(uVar13,&(sgrids->alloc).hugepages);
    }
    sgrids->items = pSVar9;
    if (sgrids->size_active == 0) {
      sVar8 = sgrids->size_alloced;
      if (ptr != (SubGridBuildData *)0x0) goto LAB_00b5cd85;
    }
    else {
      uVar13 = 0;
      do {
        sgrids->items[uVar13] = ptr[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar13 < sgrids->size_active);
      sVar8 = sgrids->size_alloced;
LAB_00b5cd85:
      if (sVar8 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar8 * 8,(sgrids->alloc).hugepages);
      }
    }
    if (sVar8 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar8 * -8,1);
    }
    sgrids->size_active = uVar16;
    sgrids->size_alloced = uVar18;
    pPVar21 = local_2958;
  }
  uVar13 = prims->size_alloced;
  uVar18 = uVar13;
  if ((uVar13 < uVar16) && (uVar18 = uVar16, uVar19 = uVar13, uVar13 != 0)) {
    do {
      uVar18 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0);
      uVar19 = uVar18;
    } while (uVar18 < uVar16);
  }
  if (uVar16 < prims->size_active) {
    prims->size_active = uVar16;
  }
  if (uVar13 == uVar18) {
    prims->size_active = uVar16;
    goto LAB_00b5ceef;
  }
  ptr_00 = prims->items;
  if (uVar18 == 0) {
    sVar8 = 0;
LAB_00b5ce4c:
    pPVar10 = (PrimRef *)alignedMalloc(sVar8,0x20);
  }
  else {
    pMVar3 = (prims->alloc).device;
    sVar8 = uVar18 << 5;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar8,0);
    if (sVar8 < 0x1c00000) goto LAB_00b5ce4c;
    pPVar10 = (PrimRef *)os_malloc(sVar8,&(prims->alloc).hugepages);
  }
  prims->items = pPVar10;
  if (prims->size_active == 0) {
    sVar8 = prims->size_alloced;
    if (ptr_00 != (PrimRef *)0x0) goto LAB_00b5ce9f;
  }
  else {
    lVar11 = 0x10;
    uVar13 = 0;
    do {
      pPVar10 = prims->items;
      puVar1 = (undefined8 *)((long)ptr_00 + lVar11 + -0x10);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pPVar10 + lVar11 + -0x10);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      puVar1 = (undefined8 *)((long)&(ptr_00->lower).field_0 + lVar11);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pPVar10->lower).field_0 + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      uVar13 = uVar13 + 1;
      lVar11 = lVar11 + 0x20;
    } while (uVar13 < prims->size_active);
    sVar8 = prims->size_alloced;
LAB_00b5ce9f:
    if (sVar8 << 5 < 0x1c00000) {
      alignedFree(ptr_00);
    }
    else {
      os_free(ptr_00,sVar8 << 5,(prims->alloc).hugepages);
    }
  }
  if (sVar8 != 0) {
    pMVar3 = (prims->alloc).device;
    (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar8 * -0x20,1);
  }
  prims->size_active = uVar16;
  prims->size_alloced = uVar18;
  pPVar21 = local_2958;
LAB_00b5ceef:
  uVar13 = (ulong)(local_2928->super_Geometry).numPrimitives;
  local_2920 = &local_2928;
  local_2908 = &local_292c;
  local_2950[1] = 0;
  local_2950[0] = uVar13;
  local_2918 = prims;
  local_2910 = sgrids;
  iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var20 = (_func_int **)(uVar13 + 0x3ff >> 10);
  if ((_func_int **)(long)iVar6 < pp_Var20) {
    pp_Var20 = (_func_int **)(long)iVar6;
  }
  pp_Var17 = (_func_int **)0x40;
  if (pp_Var20 < (_func_int **)0x40) {
    pp_Var17 = pp_Var20;
  }
  local_2900 = local_2950 + 1;
  local_28f8 = local_2950;
  local_28f0 = &local_2960;
  local_28e8 = local_2838;
  local_28e0 = &local_2920;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2960 = pp_Var17;
  tbb::detail::r1::initialize(&local_28b8);
  local_2940 = &local_2900;
  if (pp_Var20 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar7 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar7->m_reserved[3] = 0;
    ptVar7->m_reserved[4] = 0;
    ptVar7->m_reserved[1] = 0;
    ptVar7->m_reserved[2] = 0;
    (ptVar7->super_task_traits).m_version_and_traits = 0;
    ptVar7->m_reserved[0] = 0;
    ptVar7->m_reserved[5] = 0;
    ptVar7->_vptr_task = (_func_int **)&PTR__task_0218a2c0;
    ptVar7[1]._vptr_task = pp_Var17;
    ptVar7[1].super_task_traits.m_version_and_traits = 0;
    ptVar7[1].m_reserved[0] = 1;
    ptVar7[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar7[1].m_reserved[2] = 0;
    ptVar7[1].m_reserved[3] = 1;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar7[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar7[2]._vptr_task + 4) = 5;
    ptVar7[1].m_reserved[5] = (long)iVar6 * 2 & 0x7ffffffffffffffe;
    ptVar7[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar7[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar7,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar5 != '\0') {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"task cancelled");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar22 = _DAT_01f7aa00;
  aVar23 = _DAT_01f7a9f0;
  aVar24 = _DAT_01f7aa00;
  aVar25 = _DAT_01f7a9f0;
  if (local_2960 == (_func_int **)0x0) {
    sVar15 = 0;
    sVar8 = 0;
  }
  else {
    psVar14 = local_13f0;
    sVar8 = 0;
    sVar15 = 0;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -9) = aVar25;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -7) = aVar22;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -5) = aVar23;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar14 + -3) = aVar24;
      psVar14[-1] = sVar15;
      *psVar14 = sVar8;
      aVar25.m128 = (__m128)minps(aVar25.m128,*(undefined1 (*) [16])(psVar14 + -0x289));
      aVar22.m128 = (__m128)maxps(aVar22.m128,*(undefined1 (*) [16])(psVar14 + -0x287));
      aVar23.m128 = (__m128)minps(aVar23.m128,*(undefined1 (*) [16])(psVar14 + -0x285));
      aVar24.m128 = (__m128)maxps(aVar24.m128,*(undefined1 (*) [16])(psVar14 + -0x283));
      sVar15 = sVar15 + psVar14[-0x281];
      sVar8 = sVar8 + psVar14[-0x280];
      psVar14 = psVar14 + 10;
      local_2960 = (_func_int **)((long)local_2960 + -1);
    } while (local_2960 != (_func_int **)0x0);
  }
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar25;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar22;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar23;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar24;
  pPVar21->begin = sVar15;
  pPVar21->end = sVar8;
  return pPVar21;
}

Assistant:

PrimInfo createPrimRefArrayGrids(GridMesh* mesh, mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids)
    {
      unsigned int geomID_ = std::numeric_limits<unsigned int>::max ();

      PrimInfo pinfo(empty);
      size_t numPrimitives = 0;
      
      ParallelPrefixSumState<PrimInfo> pstate;
      /* iterate over all grids in a single mesh */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo
                                   {
                                     PrimInfo pinfo(empty);
                                     for (size_t j=r.begin(); j<r.end(); j++)
                                     {
                                       if (!mesh->valid(j)) continue;
                                       BBox3fa bounds = empty;
                                       const PrimRef prim(bounds,geomID_,unsigned(j));
                                       pinfo.add_center2(prim,mesh->getNumSubGrids(j));
                                     }
                                     return pinfo;
                                   }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      numPrimitives = pinfo.size();
      /* resize arrays */
      sgrids.resize(numPrimitives); 
      prims.resize(numPrimitives); 

      /* second run to fill primrefs and SubGridBuildData arrays */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
        return mesh->createPrimRefArray(prims,sgrids,r,base.size(),geomID_);
      }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      return pinfo;
    }